

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

void __thiscall soplex::LPColSetBase<double>::reMax(LPColSetBase<double> *this,int newmax)

{
  ptrdiff_t delta;
  
  delta = ClassSet<soplex::SVSetBase<double>::DLPSV>::reMax
                    (&(this->super_SVSetBase<double>).set,newmax);
  IdList<soplex::SVSetBase<double>::DLPSV>::move(&(this->super_SVSetBase<double>).list,delta);
  std::vector<double,_std::allocator<double>_>::reserve
            (&(this->up).val,(long)(this->super_SVSetBase<double>).set.themax);
  std::vector<double,_std::allocator<double>_>::reserve
            (&(this->low).val,(long)(this->super_SVSetBase<double>).set.themax);
  std::vector<double,_std::allocator<double>_>::reserve
            (&(this->object).val,(long)(this->super_SVSetBase<double>).set.themax);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.themax);
  return;
}

Assistant:

void reMax(int newmax = 0)
   {
      SVSetBase<R>::reMax(newmax);
      up.reSize(max());
      low.reSize(max());
      object.reSize(max());
      scaleExp.reSize(max());
   }